

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JointPolicyPureVector.h
# Opt level: O2

void __thiscall
JointPolicyPureVector::JointPolicyPureVector(JointPolicyPureVector *this,I_PtPDpure_constPtr *pu)

{
  undefined4 uVar1;
  
  uVar1 = (**(code **)(*(long *)pu->px + 0x40))();
  JointPolicyDiscretePure::JointPolicyDiscretePure((JointPolicyDiscretePure *)this,pu,uVar1);
  uVar1 = (**(code **)(*(long *)pu->px + 0x40))();
  JPolComponent_VectorImplementation::JPolComponent_VectorImplementation
            ((JPolComponent_VectorImplementation *)(this + 0x38),pu,uVar1,999999);
  *(code **)this = ValueFunctionDecPOMDPDiscrete::CalculateV<false>;
  *(code **)(this + 0x38) = JointBelief::Update;
  *(undefined8 *)(this + 0x90) = 0;
  *(undefined8 *)(this + 0x80) = 0;
  *(undefined8 *)(this + 0x88) = 0;
  return;
}

Assistant:

JointPolicyPureVector(I_PtPDpure_constPtr pu)
          :
          JointPolicyDiscretePure( pu , pu->GetDefaultIndexDomCat()  ),
          JPolComponent_VectorImplementation(pu,  pu->GetDefaultIndexDomCat() )
        {}